

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::RefcountedClient::~RefcountedClient
          (RefcountedClient *this)

{
  NetworkAddressHttpClient *pNVar1;
  EntropySource *pEVar2;
  HttpClientImpl *this_00;
  _Map_pointer __src;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  _Map_pointer ppAVar6;
  AvailableClient *pAVar7;
  _Elt_pointer pAVar8;
  size_t sVar9;
  _Map_pointer ppAVar10;
  NetworkAddress *pNVar11;
  Exception *exception;
  long lVar12;
  _Map_pointer __dest;
  long lVar13;
  undefined1 local_520 [16];
  HttpClientImpl *local_510;
  Disposer *local_508;
  NetworkAddress *local_500;
  Duration local_4f8;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> local_4f0;
  long local_4e0;
  NullableValue<kj::Exception> local_360;
  NullableValue<kj::Exception> _exception6045;
  
  pNVar1 = this->parent;
  pNVar1->activeConnectionCount = pNVar1->activeConnectionCount - 1;
  pEVar2 = (EntropySource *)(this->client).disposer;
  this_00 = (this->client).ptr;
  (this->client).ptr = (HttpClientImpl *)0x0;
  local_520._8_8_ = pEVar2;
  local_510 = this_00;
  bVar4 = HttpClientImpl::canReuse(this_00);
  if ((!bVar4) || ((pNVar1->settings).idleTimeout.value < 1)) goto LAB_0037f987;
  local_510 = (HttpClientImpl *)0x0;
  local_4f0.disposer = (Disposer *)pEVar2;
  local_4f0.ptr = this_00;
  iVar5 = (**(pNVar1->timer->super_MonotonicClock)._vptr_MonotonicClock)();
  local_4e0 = CONCAT44(extraout_var,iVar5) + (pNVar1->settings).idleTimeout.value;
  pAVar8 = (pNVar1->availableClients).
           super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar8 == (pNVar1->availableClients).
                super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ppAVar10 = (pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    __src = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar13 = (long)ppAVar10 - (long)__src >> 3;
    local_4f8.value = local_4e0;
    if (((long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
        (long)(pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) / 0x18 +
        ((long)pAVar8 -
        (long)(pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) / 0x18 +
        (lVar13 + -1 + (ulong)(ppAVar10 == (_Map_pointer)0x0)) * 0x15 == 0xaaaaaaaaaaaaaaa) {
      std::__throw_length_error("cannot create std::deque larger than max_size()");
    }
    ppAVar6 = (pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_map;
    uVar3 = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    if (uVar3 - ((long)ppAVar10 - (long)ppAVar6 >> 3) < 2) {
      pNVar11 = (NetworkAddress *)(lVar13 + 1);
      if (lVar13 * 2 + 4U < uVar3) {
        __dest = (_Map_pointer)((long)ppAVar6 + (uVar3 - (lVar13 + 2) & 0xfffffffffffffffe) * 4);
        if (__dest < __src) {
          sVar9 = (long)ppAVar10 + (8 - (long)__src);
          ppAVar10 = __dest;
          if (sVar9 != 0) {
LAB_0037f8c3:
            memmove(ppAVar10,__src,sVar9);
          }
        }
        else {
          sVar9 = (long)ppAVar10 + (8 - (long)__src);
          if (sVar9 != 0) {
            ppAVar10 = (_Map_pointer)((long)__dest + ((long)pNVar11 * 8 - sVar9));
            goto LAB_0037f8c3;
          }
        }
      }
      else {
        lVar12 = uVar3 * 2 + (ulong)(uVar3 == 0);
        local_508 = (Disposer *)(lVar12 + 2);
        local_500 = pNVar11;
        if ((ulong)local_508 >> 0x3c != 0) {
          if ((ulong)local_508 >> 0x3d != 0) {
            std::__throw_bad_array_new_length();
          }
          std::__throw_bad_alloc();
        }
        ppAVar6 = (_Map_pointer)operator_new((long)local_508 * 8);
        __dest = (_Map_pointer)((long)ppAVar6 + (lVar12 - lVar13 & 0xfffffffffffffffeU) * 4);
        ppAVar10 = (pNVar1->availableClients).
                   super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        sVar9 = (long)(pNVar1->availableClients).
                      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppAVar10);
        if (sVar9 != 0) {
          memmove(__dest,ppAVar10,sVar9);
        }
        operator_delete((pNVar1->availableClients).
                        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (pNVar1->availableClients).
                        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                        ._M_impl.super__Deque_impl_data._M_map_size << 3);
        (pNVar1->availableClients).
        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ._M_impl.super__Deque_impl_data._M_map = ppAVar6;
        (pNVar1->availableClients).
        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ._M_impl.super__Deque_impl_data._M_map_size = (size_t)local_508;
        pNVar11 = local_500;
      }
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
      pAVar7 = *__dest;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = pAVar7;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = pAVar7 + 0x15;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node =
           __dest + (long)((long)&pNVar11[-1]._vptr_NetworkAddress + 7);
      pAVar7 = __dest[(long)((long)&pNVar11[-1]._vptr_NetworkAddress + 7)];
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar7;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar7 + 0x15;
    }
    pAVar7 = (AvailableClient *)operator_new(0x1f8);
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pAVar7;
    pAVar8 = (pNVar1->availableClients).
             super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    (pAVar8->client).disposer = (Disposer *)pEVar2;
    (pAVar8->client).ptr = this_00;
    (pAVar8->expires).value.value = local_4f8.value;
    ppAVar10 = (pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = ppAVar10 + 1;
    pAVar8 = ppAVar10[1];
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar8;
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar8 + 0x15;
  }
  else {
    (pAVar8->client).disposer = (Disposer *)pEVar2;
    (pAVar8->client).ptr = this_00;
    (pAVar8->expires).value.value = local_4e0;
    pAVar8 = pAVar8 + 1;
  }
  local_4f0.ptr = (HttpClientImpl *)0x0;
  (pNVar1->availableClients).
  super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pAVar8;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own(&local_4f0);
LAB_0037f987:
  if (pNVar1->timeoutsScheduled == false) {
    pNVar1->timeoutsScheduled = true;
    applyTimeouts((NetworkAddressHttpClient *)local_520);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&pNVar1->timeoutTask,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_520);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_520);
  }
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)(local_520 + 8));
  local_360.isSet = false;
  kj::_::NullableValue<kj::Exception>::NullableValue(&_exception6045,&local_360);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_360);
  if ((_exception6045.isSet == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<kj::Exception&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x179e,ERROR,"exception",&_exception6045.field_1.value);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_exception6045);
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own(&this->client);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RefcountedClient() noexcept(false) {
      --parent.activeConnectionCount;
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        parent.returnClientToAvailable(kj::mv(client));
      })) {
        KJ_LOG(ERROR, exception);
      }
    }